

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_3,_2>,_tcu::Vector<double,_3>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Matrix<double,_3,_2>,_tcu::Vector<double,_3>,_tcu::Vector<double,_2>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  Vector<double,_3> arg_1;
  Matrix<double,_3,_2> result;
  Vector<double,_3> local_a8;
  Matrix<double,_3,_2> local_90;
  Matrix<double,_3,_2> local_60;
  
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_3>::Vector(&local_a8);
  tcu::Matrix<double,_3,_2>::Matrix(&local_60);
  local_a8.m_data[2] = *(double *)((long)argument_src + 0x10);
  local_a8.m_data[0] = *argument_src;
  local_a8.m_data[1] = *(double *)((long)argument_src + 8);
  (*pcVar1)(&local_90,&local_a8);
  tcu::Matrix<double,_3,_2>::operator=(&local_60,&local_90);
  pack<tcu::Matrix<double,_3,_2>_>::set(result_dst,&local_60);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}